

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O2

vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_> *
__thiscall
google::protobuf::compiler::cpp::anon_unknown_3::Map::MakeVars
          (vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>
           *__return_storage_ptr__,Map *this)

{
  bool bVar1;
  uint uVar2;
  Options *this_00;
  long lVar3;
  cpp *pcVar4;
  CppType type;
  Options *in_RCX;
  size_type *psVar5;
  Arg *in_R9;
  char *pcVar6;
  string_view format;
  initializer_list<google::protobuf::io::Printer::Sub> __l;
  undefined1 auVar7 [16];
  allocator_type local_576;
  allocator<char> local_575;
  allocator<char> local_574;
  allocator<char> local_573;
  allocator<char> local_572;
  allocator<char> local_571;
  string val_type;
  string key_type;
  char *local_530;
  string local_528;
  string local_508;
  string local_4e8;
  string local_4c8;
  string local_4a8;
  string local_488;
  string local_468;
  string local_448;
  Arg local_428;
  size_type local_3f8;
  pointer local_3f0;
  Sub local_3c8 [4];
  Sub local_e8;
  
  this_00 = this->opts_;
  bVar1 = this->lite_;
  google::protobuf::FieldDescriptor::message_type();
  lVar3 = google::protobuf::Descriptor::map_key();
  google::protobuf::FieldDescriptor::message_type();
  pcVar4 = (cpp *)google::protobuf::Descriptor::map_value();
  PrimitiveTypeName_abi_cxx11_
            (&key_type,(cpp *)this_00,
             (Options *)
             (ulong)*(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(byte *)(lVar3 + 2) * 4),(CppType)in_RCX);
  val_type._M_dataplus._M_p = (pointer)&val_type.field_2;
  val_type._M_string_length = 0;
  val_type.field_2._M_local_buf[0] = '\0';
  uVar2 = *(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap + (ulong)(byte)pcVar4[2] * 4);
  if (uVar2 == 8) {
    pcVar4 = (cpp *)google::protobuf::FieldDescriptor::enum_type();
    ClassName_abi_cxx11_(&local_3c8[0].key_,pcVar4,(EnumDescriptor *)0x1,SUB81(in_RCX,0));
  }
  else if (uVar2 == 10) {
    FieldMessageTypeName_abi_cxx11_(&local_3c8[0].key_,pcVar4,(FieldDescriptor *)this_00,in_RCX);
  }
  else {
    PrimitiveTypeName_abi_cxx11_
              (&local_3c8[0].key_,(cpp *)this_00,(Options *)(ulong)uVar2,(CppType)in_RCX);
  }
  std::__cxx11::string::operator=((string *)&val_type,(string *)local_3c8);
  std::__cxx11::string::~string((string *)local_3c8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_448,"Map",&local_571);
  psVar5 = &local_3f8;
  local_3f8 = key_type._M_string_length;
  local_3f0 = key_type._M_dataplus._M_p;
  local_428.piece_._M_len = val_type._M_string_length;
  local_428.piece_._M_str = val_type._M_dataplus._M_p;
  format._M_str = (char *)psVar5;
  format._M_len = (size_t)"::google::protobuf::Map<$0, $1>";
  absl::lts_20240722::Substitute_abi_cxx11_(&local_468,(lts_20240722 *)0x1f,format,&local_428,in_R9)
  ;
  type = (CppType)psVar5;
  io::Printer::Sub::Sub<std::__cxx11::string>(local_3c8,&local_448,&local_468);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_488,"Entry",&local_572);
  auVar7 = google::protobuf::FieldDescriptor::message_type();
  ClassName_abi_cxx11_(&local_4a8,auVar7._0_8_,auVar7._8_8_);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_3c8 + 1,&local_488,&local_4a8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,"Key",&local_573);
  PrimitiveTypeName_abi_cxx11_
            (&local_4e8,(cpp *)this_00,
             (Options *)
             (ulong)*(uint *)((long)&FieldDescriptor::kTypeToCppTypeMap +
                             (ulong)*(byte *)(lVar3 + 2) * 4),type);
  io::Printer::Sub::Sub<std::__cxx11::string>(local_3c8 + 2,&local_4c8,&local_4e8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_508,"Val",&local_574);
  io::Printer::Sub::Sub<std::__cxx11::string&>(local_3c8 + 3,&local_508,&val_type);
  pcVar6 = "MapField";
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_528,"MapField",&local_575);
  if (bVar1 != false) {
    pcVar6 = "MapFieldLite";
  }
  local_530 = pcVar6;
  io::Printer::Sub::Sub<char_const*>(&local_e8,&local_528,&local_530);
  __l._M_len = 5;
  __l._M_array = local_3c8;
  std::
  vector<google::protobuf::io::Printer::Sub,_std::allocator<google::protobuf::io::Printer::Sub>_>::
  vector(__return_storage_ptr__,__l,&local_576);
  lVar3 = 0x2e0;
  do {
    io::Printer::Sub::~Sub((Sub *)((long)&local_3c8[0].key_._M_dataplus._M_p + lVar3));
    lVar3 = lVar3 + -0xb8;
  } while (lVar3 != -0xb8);
  std::__cxx11::string::~string((string *)&local_528);
  std::__cxx11::string::~string((string *)&local_508);
  std::__cxx11::string::~string((string *)&local_4e8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::__cxx11::string::~string((string *)&local_4a8);
  std::__cxx11::string::~string((string *)&local_488);
  std::__cxx11::string::~string((string *)&local_468);
  std::__cxx11::string::~string((string *)&local_448);
  std::__cxx11::string::~string((string *)&val_type);
  std::__cxx11::string::~string((string *)&key_type);
  return __return_storage_ptr__;
}

Assistant:

std::vector<Sub> MakeVars() const override {
    return Vars(field_, *opts_, lite_);
  }